

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O3

void __thiscall
TEST_MockSupportTestWithFixture_shouldCrashOnFailureWithCppUTestSetting_Test::
~TEST_MockSupportTestWithFixture_shouldCrashOnFailureWithCppUTestSetting_Test
          (TEST_MockSupportTestWithFixture_shouldCrashOnFailureWithCppUTestSetting_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockSupportTestWithFixture).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMockSupportTestWithFixture_002e5bc0;
  TestTestingFixture::~TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupMockSupportTestWithFixture).fixture);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockSupportTestWithFixture, shouldCrashOnFailureWithCppUTestSetting)
{
    cpputestHasCrashed = false;
    UtestShell::setCrashOnFail();
    UtestShell::setCrashMethod(crashMethod);
    fixture.setTestFunction(unexpectedCallTestFunction_);

    fixture.runAllTests();

    CHECK(cpputestHasCrashed);

    UtestShell::restoreDefaultTestTerminator();
    UtestShell::resetCrashMethod();
}